

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.hpp
# Opt level: O1

void __thiscall
helics::BasicHandleInfo::BasicHandleInfo
          (BasicHandleInfo *this,GlobalFederateId federate_id,InterfaceHandle handle_id,
          InterfaceType type_of_handle,string_view key_name,string_view type_name,
          string_view unit_name)

{
  (this->handle).fed_id.gid = federate_id.gid;
  (this->handle).handle.hid = handle_id.hid;
  (this->local_fed_id).fid = -2000000000;
  this->handleType = type_of_handle;
  this->used = false;
  this->flags = 0;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->key,key_name._M_str,key_name._M_str + key_name._M_len);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->type,type_name._M_str,type_name._M_str + type_name._M_len);
  (this->units)._M_dataplus._M_p = (pointer)&(this->units).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->units,unit_name._M_str,unit_name._M_str + unit_name._M_len);
  this->type_in = &this->type;
  this->type_out = &this->units;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

BasicHandleInfo(GlobalFederateId federate_id,
                    InterfaceHandle handle_id,
                    InterfaceType type_of_handle,
                    std::string_view key_name,
                    std::string_view type_name,
                    std::string_view unit_name):
        handle{federate_id, handle_id}, handleType(type_of_handle), key(key_name), type(type_name),
        units(unit_name), type_in(type), type_out(units)

    {
    }